

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_json_transaction.cpp
# Opt level: O0

ByteData *
cfd::api::json::TransactionJsonApi::ConvertSignDataToSignature
          (string *hex_string,bool is_sign,bool is_der_encode,string *sighash_type,
          bool sighash_anyone_can_pay)

{
  ulong uVar1;
  char *pcVar2;
  undefined8 uVar3;
  byte in_CL;
  byte in_DL;
  SigHashType *in_RSI;
  string *in_RDI;
  SigHashType sighashtype;
  ByteData *byte_data;
  ByteData *in_stack_ffffffffffffff28;
  CfdSourceLocation *in_stack_ffffffffffffff30;
  string *psVar4;
  CfdError error_code;
  CfdException *in_stack_ffffffffffffff50;
  string local_98 [38];
  undefined1 local_72;
  allocator local_71;
  string local_70 [55];
  undefined1 is_anyone_can_pay;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  is_anyone_can_pay = (undefined1)((ulong)stack0xffffffffffffffc0 >> 0x38);
  psVar4 = in_RDI;
  cfd::core::ByteData::ByteData((ByteData *)in_RDI);
  if (((in_DL & 1) == 0) || ((in_CL & 1) == 0)) {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      cfd::core::ByteData::ByteData((ByteData *)&stack0xffffffffffffff50,(string *)in_RSI);
      core::ByteData::operator=((ByteData *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      core::ByteData::~ByteData((ByteData *)0x495a7e);
    }
  }
  else {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) != 0) {
      pcVar2 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/jsonapi/cfd_json_transaction.cpp"
                       ,0x2f);
      error_code = (CfdError)((ulong)psVar4 >> 0x20);
      register0x00000000 = pcVar2 + 1;
      core::logger::warn<>(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
      local_72 = 1;
      uVar3 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"Invalid hex string. empty sign hex.",&local_71);
      core::CfdException::CfdException(in_stack_ffffffffffffff50,error_code,in_RDI);
      local_72 = 0;
      __cxa_throw(uVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    ConvertSigHashType((string *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (bool)is_anyone_can_pay);
    cfd::core::CryptoUtil::ConvertSignatureToDer(local_98,in_RSI);
    core::ByteData::operator=((ByteData *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    core::ByteData::~ByteData((ByteData *)0x495a3a);
  }
  return (ByteData *)psVar4;
}

Assistant:

ByteData TransactionJsonApi::ConvertSignDataToSignature(
    const std::string& hex_string, bool is_sign, bool is_der_encode,
    const std::string& sighash_type, bool sighash_anyone_can_pay) {
  ByteData byte_data;
  if (is_sign && is_der_encode) {
    if (hex_string.empty()) {
      warn(CFD_LOG_SOURCE, "Failed to AddMultisigSign. sign hex empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid hex string. empty sign hex.");
    }
    SigHashType sighashtype = TransactionJsonApi::ConvertSigHashType(
        sighash_type, sighash_anyone_can_pay);
    byte_data = CryptoUtil::ConvertSignatureToDer(hex_string, sighashtype);
  } else if (hex_string.empty()) {
    // do nothing
  } else {
    byte_data = ByteData(hex_string);
  }
  return byte_data;
}